

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void qDeleteAll<QList<QOpenGLEngineShaderProg*>::const_iterator>
               (const_iterator begin,const_iterator end)

{
  QOpenGLEngineShaderProg *this;
  
  if (begin.i != end.i) {
    do {
      this = *begin.i;
      if (this != (QOpenGLEngineShaderProg *)0x0) {
        QOpenGLEngineShaderProg::~QOpenGLEngineShaderProg(this);
        operator_delete(this,0x58);
      }
      begin.i = begin.i + 1;
    } while (begin.i != end.i);
  }
  return;
}

Assistant:

inline constexpr bool operator!=(const_iterator o) const { return i != o.i; }